

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_no_value.hpp
# Opt level: O0

void __thiscall
cfgfile::tag_no_value_t<cfgfile::qstring_trait_t>::on_string
          (tag_no_value_t<cfgfile::qstring_trait_t> *this,
          parser_info_t<cfgfile::qstring_trait_t> *info,string_t *str)

{
  undefined8 uVar1;
  parser_info_t<cfgfile::qstring_trait_t> *in_RSI;
  tag_t<cfgfile::qstring_trait_t> *in_RDI;
  string_t *what;
  exception_t<cfgfile::qstring_trait_t> *this_00;
  undefined6 in_stack_fffffffffffffdc0;
  undefined1 uVar2;
  undefined1 in_stack_fffffffffffffdc7;
  string *in_stack_fffffffffffffdc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd0;
  string_t local_1a1 [2];
  exception_t<cfgfile::qstring_trait_t> local_161 [8];
  parser_info_t<cfgfile::qstring_trait_t> *local_10;
  
  uVar2 = 1;
  local_10 = in_RSI;
  uVar1 = __cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8,
             (allocator<char> *)
             CONCAT17(in_stack_fffffffffffffdc7,CONCAT16(uVar2,in_stack_fffffffffffffdc0)));
  qstring_trait_t::from_ascii(in_stack_fffffffffffffdc8);
  tag_t<cfgfile::qstring_trait_t>::name(in_RDI);
  operator+((qstring_wrapper_t *)in_stack_fffffffffffffdc8,
            (qstring_wrapper_t *)
            CONCAT17(in_stack_fffffffffffffdc7,CONCAT16(uVar2,in_stack_fffffffffffffdc0)));
  this_00 = local_161;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8,
             (allocator<char> *)
             CONCAT17(in_stack_fffffffffffffdc7,CONCAT16(uVar2,in_stack_fffffffffffffdc0)));
  qstring_trait_t::from_ascii(in_stack_fffffffffffffdc8);
  operator+((qstring_wrapper_t *)in_stack_fffffffffffffdc8,
            (qstring_wrapper_t *)
            CONCAT17(in_stack_fffffffffffffdc7,CONCAT16(uVar2,in_stack_fffffffffffffdc0)));
  operator+((qstring_wrapper_t *)in_stack_fffffffffffffdc8,
            (qstring_wrapper_t *)
            CONCAT17(in_stack_fffffffffffffdc7,CONCAT16(uVar2,in_stack_fffffffffffffdc0)));
  what = local_1a1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8,
             (allocator<char> *)
             CONCAT17(in_stack_fffffffffffffdc7,CONCAT16(uVar2,in_stack_fffffffffffffdc0)));
  qstring_trait_t::from_ascii(in_stack_fffffffffffffdc8);
  operator+((qstring_wrapper_t *)in_stack_fffffffffffffdc8,
            (qstring_wrapper_t *)
            CONCAT17(in_stack_fffffffffffffdc7,CONCAT16(uVar2,in_stack_fffffffffffffdc0)));
  parser_info_t<cfgfile::qstring_trait_t>::file_name(local_10);
  operator+((qstring_wrapper_t *)in_stack_fffffffffffffdc8,
            (qstring_wrapper_t *)
            CONCAT17(in_stack_fffffffffffffdc7,CONCAT16(uVar2,in_stack_fffffffffffffdc0)));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8,
             (allocator<char> *)
             CONCAT17(in_stack_fffffffffffffdc7,CONCAT16(uVar2,in_stack_fffffffffffffdc0)));
  qstring_trait_t::from_ascii(in_stack_fffffffffffffdc8);
  operator+((qstring_wrapper_t *)in_stack_fffffffffffffdc8,
            (qstring_wrapper_t *)
            CONCAT17(in_stack_fffffffffffffdc7,CONCAT16(uVar2,in_stack_fffffffffffffdc0)));
  parser_info_t<cfgfile::qstring_trait_t>::line_number(local_10);
  qstring_trait_t::to_string((pos_t)in_stack_fffffffffffffdc8);
  operator+((qstring_wrapper_t *)in_stack_fffffffffffffdc8,
            (qstring_wrapper_t *)
            CONCAT17(in_stack_fffffffffffffdc7,CONCAT16(uVar2,in_stack_fffffffffffffdc0)));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8,
             (allocator<char> *)
             CONCAT17(in_stack_fffffffffffffdc7,CONCAT16(uVar2,in_stack_fffffffffffffdc0)));
  qstring_trait_t::from_ascii(in_stack_fffffffffffffdc8);
  operator+((qstring_wrapper_t *)in_stack_fffffffffffffdc8,
            (qstring_wrapper_t *)
            CONCAT17(in_stack_fffffffffffffdc7,CONCAT16(uVar2,in_stack_fffffffffffffdc0)));
  exception_t<cfgfile::qstring_trait_t>::exception_t(this_00,what);
  __cxa_throw(uVar1,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
              exception_t<cfgfile::qstring_trait_t>::~exception_t);
}

Assistant:

void on_string( const parser_info_t< Trait > & info,
		const typename Trait::string_t & str ) override
	{
		throw exception_t< Trait >( Trait::from_ascii( "Tag \"" ) +
			this->name() + Trait::from_ascii( "\" doesn't allow any values. "
				"But we've got this: \"" ) +
			str + Trait::from_ascii( "\". In file \"" ) + info.file_name() +
			Trait::from_ascii( "\" on line " ) +
			Trait::to_string( info.line_number() ) +
			Trait::from_ascii( "." ) );
	}